

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O0

void sx_hashtbltval_init(sx_hashtbl_tval *tbl,int capacity,int value_stride,uint32_t *keys_ptr,
                        void *values_ptr)

{
  code *pcVar1;
  _Bool _Var2;
  int iVar3;
  void *values_ptr_local;
  uint32_t *keys_ptr_local;
  int value_stride_local;
  int capacity_local;
  sx_hashtbl_tval *tbl_local;
  
  _Var2 = sx__ispow2(capacity);
  if (!_Var2) {
    sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/hash.c",
                      0x186,
                      "Table size must be power of 2, get it from sx_hashtbltval_valid_capacity");
    pcVar1 = (code *)swi(3);
    (*pcVar1)();
    return;
  }
  memset(keys_ptr,0,(long)capacity << 2);
  memset(values_ptr,0,(long)(capacity * value_stride));
  tbl->keys = keys_ptr;
  tbl->values = (uint8_t *)values_ptr;
  iVar3 = sx__calc_bitshift(capacity);
  tbl->_bitshift = iVar3;
  tbl->value_stride = value_stride;
  tbl->capacity = capacity;
  tbl->count = 0;
  tbl->_miss_cnt = 0;
  tbl->_probe_cnt = 0;
  return;
}

Assistant:

void sx_hashtbltval_init(sx_hashtbl_tval* tbl, int capacity, int value_stride, uint32_t* keys_ptr, void* values_ptr)
{
    sx_assertf(sx__ispow2(capacity),
              "Table size must be power of 2, get it from sx_hashtbltval_valid_capacity");

    sx_memset(keys_ptr, 0x0, capacity * sizeof(uint32_t));
    sx_memset(values_ptr, 0x0, capacity * value_stride);

    tbl->keys = keys_ptr;
    tbl->values = values_ptr;
    tbl->_bitshift = sx__calc_bitshift(capacity);
    tbl->value_stride = value_stride;
    tbl->capacity = capacity;
    tbl->count = 0;
#if SX_CONFIG_HASHTBL_DEBUG
    tbl->_miss_cnt = 0;
    tbl->_probe_cnt = 0;
#endif
}